

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

char cs222::getOpcode(string *op)

{
  bool bVar1;
  char *pcVar2;
  pointer pvVar3;
  string local_90;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_true>
  local_70;
  string local_68 [48];
  undefined1 local_38 [8];
  string opp;
  string *op_local;
  
  opp.field_2._8_8_ = op;
  std::__cxx11::string::string((string *)local_38,(string *)op);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
  if (*pcVar2 == '+') {
    std::__cxx11::string::substr((ulong)local_68,opp.field_2._8_8_);
    std::__cxx11::string::operator=((string *)local_38,local_68);
    std::__cxx11::string::~string(local_68);
  }
  bVar1 = isOperation((string *)local_38);
  if (bVar1) {
    toUpper(&local_90,(string *)local_38);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>_>
                 *)OpTable_abi_cxx11_,&local_90);
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_false,_true>
                           *)&local_70);
    op_local._7_1_ = Operation::getOpcode(&pvVar3->second);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    op_local._7_1_ = -1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return op_local._7_1_;
}

Assistant:

char getOpcode(const std::string& op)
    {
        std::string opp = op;
        if (opp[0] == '+')
        {
            opp = op.substr(1);
        }
        if (isOperation(opp))
        {
            return OpTable.find(toUpper(opp))->second.getOpcode();
        }

        return -1;
    }